

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlstring.c
# Opt level: O3

xmlChar * xmlStrstr(xmlChar *str,xmlChar *val)

{
  xmlChar *pxVar1;
  size_t sVar2;
  int iVar3;
  xmlChar *pxVar4;
  xmlChar xVar5;
  long lVar6;
  
  if (val == (xmlChar *)0x0 || str == (xmlChar *)0x0) {
    return (xmlChar *)0x0;
  }
  sVar2 = strlen((char *)val);
  iVar3 = (int)sVar2;
  if (iVar3 != 0 && sVar2 < 0x80000000) {
    xVar5 = *str;
    if (xVar5 == '\0') {
      str = (xmlChar *)0x0;
    }
    else {
      pxVar4 = str;
      do {
        if (xVar5 == *val) {
          if (iVar3 < 1) {
            return pxVar4;
          }
          if (pxVar4 == val) {
            return pxVar4;
          }
          lVar6 = 0;
          while (pxVar1 = pxVar4 + lVar6, *pxVar1 == val[lVar6]) {
            if (iVar3 + -1 == (int)lVar6) {
              return pxVar4;
            }
            lVar6 = lVar6 + 1;
            if (*pxVar1 == '\0') {
              return pxVar4;
            }
          }
        }
        xVar5 = pxVar4[1];
        pxVar4 = pxVar4 + 1;
        str = (xmlChar *)0x0;
      } while (xVar5 != '\0');
    }
  }
  return str;
}

Assistant:

const xmlChar *
xmlStrstr(const xmlChar *str, const xmlChar *val) {
    int n;

    if (str == NULL) return(NULL);
    if (val == NULL) return(NULL);
    n = xmlStrlen(val);

    if (n == 0) return(str);
    while (*str != 0) { /* non input consuming */
        if (*str == *val) {
            if (!xmlStrncmp(str, val, n)) return((const xmlChar *) str);
        }
        str++;
    }
    return(NULL);
}